

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_Vec2Offset
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  VMValue *pVVar2;
  double *pdVar3;
  PClass *pPVar4;
  int iVar5;
  PClass *pPVar6;
  char *pcVar7;
  undefined8 *puVar8;
  bool bVar9;
  double local_48;
  double dStack_40;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_00435fce;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00435fbe:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00435fce:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e71,
                  "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  puVar8 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar8 == (undefined8 *)0x0) goto LAB_00435ee8;
    pPVar6 = (PClass *)puVar8[1];
    if (pPVar6 == (PClass *)0x0) {
      pPVar6 = (PClass *)(**(code **)*puVar8)(puVar8);
      puVar8[1] = pPVar6;
    }
    bVar9 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar4 && bVar9) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar4) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00435fce;
    }
  }
  else {
    if (puVar8 != (undefined8 *)0x0) goto LAB_00435fbe;
LAB_00435ee8:
    puVar8 = (undefined8 *)0x0;
  }
  if (numparam == 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x01') {
      if (numparam < 3) {
        pcVar7 = "(paramnum) < numparam";
      }
      else {
        if (param[2].field_0.field_3.Type == '\x01') {
          pVVar1 = param + 1;
          pVVar2 = param + 2;
          if (numparam == 3) {
            param = defaultparam->Array;
            if (param[3].field_0.field_3.Type == '\0') {
LAB_00435f48:
              if (param[3].field_0.i == 0) {
                P_GetOffsetPosition((double)puVar8[9],(double)puVar8[10],(pVVar1->field_0).f,
                                    (pVVar2->field_0).f);
              }
              else {
                local_48 = (double)puVar8[9] + (pVVar1->field_0).f;
                dStack_40 = (double)puVar8[10] + (pVVar2->field_0).f;
              }
              if (numret < 1) {
                iVar5 = 0;
              }
              else {
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != nullptr",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                ,0x1e75,
                                "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                if (ret->RegType != '\t') {
                  __assert_fail("RegType == (REGT_FLOAT | REGT_MULTIREG2)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                ,0x15d,"void VMReturn::SetVector2(const DVector2 &)");
                }
                pdVar3 = (double *)ret->Location;
                *pdVar3 = local_48;
                pdVar3[1] = dStack_40;
                iVar5 = 1;
              }
              return iVar5;
            }
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') goto LAB_00435f48;
            pcVar7 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1e74,
                        "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar7 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1e73,
                    "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar7 = "param[paramnum].Type == REGT_FLOAT";
  }
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1e72,
                "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Vec2Offset)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_BOOL_DEF(absolute);
	ACTION_RETURN_VEC2(self->Vec2Offset(x, y, absolute));
}